

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

int __thiscall crnd::crn_unpacker::init(crn_unpacker *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  crn_header *pcVar2;
  undefined7 extraout_var;
  uint32 in_EDX;
  
  pcVar2 = crnd_get_header(ctx,in_EDX);
  this->m_pHeader = pcVar2;
  if (pcVar2 != (crn_header *)0x0) {
    this->m_pData = (uint8 *)ctx;
    this->m_data_size = in_EDX;
    bVar1 = init_tables(this);
    if (bVar1) {
      bVar1 = decode_palettes(this);
      return (int)CONCAT71(extraout_var,bVar1);
    }
  }
  return 0;
}

Assistant:

bool init(const void* pData, uint32 data_size) {
    m_pHeader = crnd_get_header(pData, data_size);
    if (!m_pHeader)
      return false;

    m_pData = static_cast<const uint8*>(pData);
    m_data_size = data_size;

    if (!init_tables())
      return false;

    if (!decode_palettes())
      return false;

    return true;
  }